

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImTriangulator::GetNextTriangle(ImTriangulator *this,uint *out_triangle)

{
  ImTriangulatorNode *pIVar1;
  ImTriangulatorNode *pIVar2;
  ImTriangulatorNode *pIVar3;
  ImTriangulatorNode *pIVar4;
  int iVar5;
  ImTriangulatorNode **ppIVar6;
  
  if ((this->_Ears).Size == 0) {
    pIVar1 = this->_Nodes;
    pIVar2 = pIVar1->Next;
    pIVar1->Next = pIVar1;
    pIVar1->Prev = pIVar1;
    pIVar4 = pIVar1;
    while (pIVar2 != pIVar1) {
      pIVar3 = pIVar2->Next;
      pIVar2->Next = pIVar4;
      pIVar4->Prev = pIVar2;
      pIVar1->Next = pIVar2;
      pIVar2->Prev = pIVar1;
      pIVar4 = pIVar2;
      pIVar2 = pIVar3;
    }
    this->_Nodes = pIVar4;
    if (-1 < this->_TrianglesLeft) {
      ppIVar6 = &this->_Nodes;
      iVar5 = this->_TrianglesLeft + 1;
      do {
        pIVar1 = *ppIVar6;
        pIVar1->Type = ImTriangulatorNodeType_Convex;
        ppIVar6 = &pIVar1->Next;
        iVar5 = iVar5 + -1;
      } while (0 < iVar5);
    }
    (this->_Reflexes).Size = 0;
    BuildReflexes(this);
    BuildEars(this);
    if ((this->_Ears).Size == 0) {
      *(this->_Ears).Data = this->_Nodes;
      (this->_Ears).Size = 1;
    }
  }
  iVar5 = (this->_Ears).Size;
  (this->_Ears).Size = iVar5 + -1;
  pIVar1 = (this->_Ears).Data[(long)iVar5 + -1];
  pIVar2 = pIVar1->Prev;
  *out_triangle = pIVar2->Index;
  out_triangle[1] = pIVar1->Index;
  pIVar4 = pIVar1->Next;
  out_triangle[2] = pIVar4->Index;
  pIVar4->Prev = pIVar2;
  pIVar2 = pIVar1->Prev;
  pIVar2->Next = pIVar4;
  if (pIVar1 == this->_Nodes) {
    this->_Nodes = pIVar1->Next;
  }
  ReclassifyNode(this,pIVar2);
  ReclassifyNode(this,pIVar1->Next);
  this->_TrianglesLeft = this->_TrianglesLeft + -1;
  return;
}

Assistant:

void ImTriangulator::GetNextTriangle(unsigned int out_triangle[3])
{
    if (_Ears.Size == 0)
    {
        FlipNodeList();

        ImTriangulatorNode* node = _Nodes;
        for (int i = _TrianglesLeft; i >= 0; i--, node = node->Next)
            node->Type = ImTriangulatorNodeType_Convex;
        _Reflexes.Size = 0;
        BuildReflexes();
        BuildEars();

        // If we still don't have ears, it means geometry is degenerated.
        if (_Ears.Size == 0)
        {
            // Return first triangle available, mimicking the behavior of convex fill.
            IM_ASSERT(_TrianglesLeft > 0); // Geometry is degenerated
            _Ears.Data[0] = _Nodes;
            _Ears.Size    = 1;
        }
    }

    ImTriangulatorNode* ear = _Ears.Data[--_Ears.Size];
    out_triangle[0] = ear->Prev->Index;
    out_triangle[1] = ear->Index;
    out_triangle[2] = ear->Next->Index;

    ear->Unlink();
    if (ear == _Nodes)
        _Nodes = ear->Next;

    ReclassifyNode(ear->Prev);
    ReclassifyNode(ear->Next);
    _TrianglesLeft--;
}